

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_cycler.cpp
# Opt level: O3

void __thiscall FCycler::Update(FCycler *this,float diff)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (this->m_shouldCycle != true) {
    return;
  }
  fVar1 = this->m_start;
  fVar3 = this->m_end;
  fVar5 = diff + this->m_time;
  this->m_time = fVar5;
  fVar2 = this->m_cycle;
  if (fVar2 <= fVar5) {
    this->m_time = fVar2;
    fVar5 = fVar2;
  }
  if (CYCLE_Square < this->m_cycleType) goto LAB_00378c45;
  fVar6 = fVar3 - fVar1;
  fVar4 = fVar5 / fVar2;
  switch(this->m_cycleType) {
  case CYCLE_Linear:
    if (this->m_increment == true) goto LAB_00378bdf;
    fVar3 = fVar3 - fVar4 * fVar6;
    break;
  case CYCLE_Sin:
    fVar3 = sinf(fVar4 * 6.2831855);
    goto LAB_00378c19;
  case CYCLE_Cos:
    fVar3 = cosf(fVar4 * 6.2831855);
LAB_00378c19:
    fVar3 = (fVar3 * 0.5 + 0.5) * fVar6 + fVar1;
    break;
  case CYCLE_SawTooth:
LAB_00378bdf:
    this->m_current = fVar4 * fVar6 + fVar1;
    goto LAB_00378c45;
  case CYCLE_Square:
    if (this->m_increment == true) {
      this->m_current = fVar1;
      goto LAB_00378c45;
    }
  }
  this->m_current = fVar3;
LAB_00378c45:
  if (fVar5 == fVar2) {
    this->m_time = 0.0;
    this->m_increment = (bool)(this->m_increment ^ 1);
  }
  return;
}

Assistant:

void FCycler::Update(float diff)
{
	float mult, angle;
	float step = m_end - m_start;
	
	if (!m_shouldCycle)
	{
		return;
	}
	
	m_time += diff;
	if (m_time >= m_cycle)
	{
		m_time = m_cycle;
	}
	
	mult = m_time / m_cycle;
	
	switch (m_cycleType)
	{
	case CYCLE_Linear:
		if (m_increment)
		{
			m_current = m_start + (step * mult);
		}
		else
		{
			m_current = m_end - (step * mult);
		}
		break;
	case CYCLE_Sin:
		angle = float(M_PI * 2.f * mult);
		mult = sinf(angle);
		mult = (mult + 1.f) / 2.f;
		m_current = m_start + (step * mult);
		break;
	case CYCLE_Cos:
		angle = float(M_PI * 2.f * mult);
		mult = cosf(angle);
		mult = (mult + 1.f) / 2.f;
		m_current = m_start + (step * mult);
		break;
	case CYCLE_SawTooth:
		m_current = m_start + (step * mult);
		break;
	case CYCLE_Square:
		if (m_increment)
		{
			m_current = m_start;
		}
		else
		{
			m_current = m_end;
		}
		break;
	}
	
	if (m_time == m_cycle)
	{
		m_time = 0.f;
		m_increment = !m_increment;
	}
}